

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemParse.cpp
# Opt level: O0

int main(int argC,char **argV)

{
  int iVar1;
  char *__s1;
  ostream *poVar2;
  SAXParser *this;
  MemBufInputSource *this_00;
  size_t sVar3;
  long lVar4;
  long lVar5;
  XMLSize_t XVar6;
  char *pcVar7;
  code *pcVar8;
  DocumentHandler *local_118;
  DTDHandler *local_108;
  OutOfMemoryException *anon_var_0;
  XMLException *e;
  unsigned_long endMillis;
  unsigned_long startMillis;
  int errorCode;
  int errorCount;
  unsigned_long duration;
  MemBufInputSource *memBufIS;
  MemParseHandlers handler;
  SAXParser *parser;
  char *parm;
  int argInd;
  bool schemaFullChecking;
  bool doSchema;
  bool doNamespaces;
  ValSchemes valScheme;
  XMLException *toCatch;
  char **argV_local;
  int argC_local;
  
  pcVar7 = (char *)0x0;
  xercesc_4_0::XMLPlatformUtils::Initialize
            ((char *)&xercesc_4_0::XMLUni::fgXercescDefaultLocale,(char *)0x0,(PanicHandler *)0x0,
             (MemoryManager *)0x0);
  parm._4_4_ = 1;
  while( true ) {
    if (argC <= parm._4_4_) {
      this = (SAXParser *)xercesc_4_0::XMemory::operator_new((XMemory *)0x108,(ulong)pcVar7);
      xercesc_4_0::SAXParser::SAXParser
                (this,(XMLValidator *)0x0,xercesc_4_0::XMLPlatformUtils::fgMemoryManager,
                 (XMLGrammarPool *)0x0);
      handler.fSpaceCount = (XMLSize_t)this;
      xercesc_4_0::SAXParser::setValidationScheme((ValSchemes)this);
      xercesc_4_0::SAXParser::setDoNamespaces(SUB81(handler.fSpaceCount,0));
      xercesc_4_0::SAXParser::setDoSchema(SUB81(handler.fSpaceCount,0));
      xercesc_4_0::SAXParser::setHandleMultipleImports(SUB81(handler.fSpaceCount,0));
      xercesc_4_0::SAXParser::setValidationSchemaFullChecking(SUB81(handler.fSpaceCount,0));
      MemParseHandlers::MemParseHandlers((MemParseHandlers *)&memBufIS);
      local_108 = (DTDHandler *)0x0;
      if (&stack0x00000000 != (undefined1 *)0x98) {
        local_108 = &handler.super_HandlerBase.super_DTDHandler;
      }
      (**(code **)(*(long *)handler.fSpaceCount + 0x20))(handler.fSpaceCount,local_108);
      local_118 = (DocumentHandler *)0x0;
      if (&stack0x00000000 != (undefined1 *)0x98) {
        local_118 = &handler.super_HandlerBase.super_DocumentHandler;
      }
      (**(code **)(*(long *)handler.fSpaceCount + 0x28))();
      this_00 = (MemBufInputSource *)
                xercesc_4_0::XMemory::operator_new((XMemory *)0x48,(ulong)local_118);
      pcVar7 = gXMLInMemBuf;
      sVar3 = strlen(gXMLInMemBuf);
      xercesc_4_0::MemBufInputSource::MemBufInputSource
                (this_00,(uchar *)pcVar7,sVar3,gMemBufId,false,
                 xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      lVar4 = xercesc_4_0::XMLPlatformUtils::getCurrentMillis();
      (**(code **)(*(long *)handler.fSpaceCount + 0x30))(handler.fSpaceCount,this_00);
      lVar5 = xercesc_4_0::XMLPlatformUtils::getCurrentMillis();
      iVar1 = xercesc_4_0::SAXParser::getErrorCount();
      if (iVar1 == 0) {
        poVar2 = std::operator<<((ostream *)&std::cout,
                                 "\nFinished parsing the memory buffer containing the following ");
        poVar2 = std::operator<<(poVar2,"XML statements:\n\n");
        poVar2 = std::operator<<(poVar2,gXMLInMemBuf);
        poVar2 = std::operator<<(poVar2,"\n\n\n");
        poVar2 = std::operator<<(poVar2,"Parsing took ");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,lVar5 - lVar4);
        poVar2 = std::operator<<(poVar2," ms (");
        XVar6 = MemParseHandlers::getElementCount((MemParseHandlers *)&memBufIS);
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,XVar6);
        poVar2 = std::operator<<(poVar2," elements, ");
        XVar6 = MemParseHandlers::getAttrCount((MemParseHandlers *)&memBufIS);
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,XVar6);
        poVar2 = std::operator<<(poVar2," attributes, ");
        XVar6 = MemParseHandlers::getSpaceCount((MemParseHandlers *)&memBufIS);
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,XVar6);
        poVar2 = std::operator<<(poVar2," spaces, ");
        XVar6 = MemParseHandlers::getCharacterCount((MemParseHandlers *)&memBufIS);
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,XVar6);
        poVar2 = std::operator<<(poVar2," characters).\n");
        std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      }
      if (handler.fSpaceCount != 0) {
        (**(code **)(*(long *)handler.fSpaceCount + 8))();
      }
      if (this_00 != (MemBufInputSource *)0x0) {
        (**(code **)(*(long *)this_00 + 8))();
      }
      xercesc_4_0::XMLPlatformUtils::Terminate();
      if (iVar1 < 1) {
        argV_local._4_4_ = 0;
      }
      else {
        argV_local._4_4_ = 4;
      }
      MemParseHandlers::~MemParseHandlers((MemParseHandlers *)&memBufIS);
      return argV_local._4_4_;
    }
    if (*argV[parm._4_4_] != '-') break;
    iVar1 = strcmp(argV[parm._4_4_],"-?");
    if (iVar1 == 0) {
      usage();
      xercesc_4_0::XMLPlatformUtils::Terminate();
      return 1;
    }
    iVar1 = strncmp(argV[parm._4_4_],"-v=",3);
    if ((iVar1 == 0) || (iVar1 = strncmp(argV[parm._4_4_],"-V=",3), iVar1 == 0)) {
      __s1 = argV[parm._4_4_] + 3;
      pcVar7 = "never";
      iVar1 = strcmp(__s1,"never");
      if (iVar1 != 0) {
        pcVar7 = "auto";
        iVar1 = strcmp(__s1,"auto");
        if (iVar1 != 0) {
          pcVar7 = "always";
          iVar1 = strcmp(__s1,"always");
          if (iVar1 != 0) {
            poVar2 = std::operator<<((ostream *)&std::cerr,"Unknown -v= value: ");
            poVar2 = std::operator<<(poVar2,__s1);
            std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
            return 2;
          }
        }
      }
    }
    else {
      pcVar7 = "-n";
      iVar1 = strcmp(argV[parm._4_4_],"-n");
      if (iVar1 != 0) {
        pcVar7 = "-N";
        iVar1 = strcmp(argV[parm._4_4_],"-N");
        if (iVar1 != 0) {
          pcVar7 = "-s";
          iVar1 = strcmp(argV[parm._4_4_],"-s");
          if (iVar1 != 0) {
            pcVar7 = "-S";
            iVar1 = strcmp(argV[parm._4_4_],"-S");
            if (iVar1 != 0) {
              pcVar7 = "-f";
              iVar1 = strcmp(argV[parm._4_4_],"-f");
              if (iVar1 != 0) {
                pcVar7 = "-F";
                iVar1 = strcmp(argV[parm._4_4_],"-F");
                if (iVar1 != 0) {
                  poVar2 = std::operator<<((ostream *)&std::cerr,"Unknown option \'");
                  poVar2 = std::operator<<(poVar2,argV[parm._4_4_]);
                  poVar2 = std::operator<<(poVar2,"\', ignoring it\n");
                  pcVar8 = std::endl<char,std::char_traits<char>>;
                  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
                  pcVar7 = (char *)pcVar8;
                }
              }
            }
          }
        }
      }
    }
    parm._4_4_ = parm._4_4_ + 1;
  }
  usage();
  xercesc_4_0::XMLPlatformUtils::Terminate();
  return 1;
}

Assistant:

int main(int argC, char* argV[])
{
    // Initialize the XML4C2 system
    try
    {
         XMLPlatformUtils::Initialize();
    }
    catch (const XMLException& toCatch)
    {
         std::cerr << "Error during initialization! Message:\n"
              << StrX(toCatch.getMessage()) << std::endl;
         return 1;
    }

    SAXParser::ValSchemes    valScheme = SAXParser::Val_Auto;
    bool doNamespaces       = false;
    bool doSchema           = false;
    bool schemaFullChecking = false;

    int argInd;
    for (argInd = 1; argInd < argC; argInd++)
    {
        // Break out on first parm not starting with a dash
        if (argV[argInd][0] != '-')
        {
            usage();
            XMLPlatformUtils::Terminate();
            return 1;
        }

        // Watch for special case help request
        if (!strcmp(argV[argInd], "-?"))
        {
            usage();
            XMLPlatformUtils::Terminate();
            return 1;
        }
         else if (!strncmp(argV[argInd], "-v=", 3)
              ||  !strncmp(argV[argInd], "-V=", 3))
        {
            const char* const parm = &argV[argInd][3];

            if (!strcmp(parm, "never"))
                valScheme = SAXParser::Val_Never;
            else if (!strcmp(parm, "auto"))
                valScheme = SAXParser::Val_Auto;
            else if (!strcmp(parm, "always"))
                valScheme = SAXParser::Val_Always;
            else
            {
                std::cerr << "Unknown -v= value: " << parm << std::endl;
                return 2;
            }
        }
         else if (!strcmp(argV[argInd], "-n")
              ||  !strcmp(argV[argInd], "-N"))
        {
            doNamespaces = true;
        }
         else if (!strcmp(argV[argInd], "-s")
              ||  !strcmp(argV[argInd], "-S"))
        {
            doSchema = true;
        }
         else if (!strcmp(argV[argInd], "-f")
              ||  !strcmp(argV[argInd], "-F"))
        {
            schemaFullChecking = true;
        }
         else
        {
            std::cerr << "Unknown option '" << argV[argInd]
                 << "', ignoring it\n" << std::endl;
        }
    }

    //
    //  Create a SAX parser object. Then, according to what we were told on
    //  the command line, set it to validate or not.
    //
    SAXParser* parser = new SAXParser;
    parser->setValidationScheme(valScheme);
    parser->setDoNamespaces(doNamespaces);
    parser->setDoSchema(doSchema);
    parser->setHandleMultipleImports (true);
    parser->setValidationSchemaFullChecking(schemaFullChecking);

    //
    //  Create our SAX handler object and install it on the parser, as the
    //  document and error handlers.
    //
    MemParseHandlers handler;
    parser->setDocumentHandler(&handler);
    parser->setErrorHandler(&handler);

    //
    //  Create MemBufferInputSource from the buffer containing the XML
    //  statements.
    //
    //  NOTE: We are using strlen() here, since we know that the chars in
    //  our hard coded buffer are single byte chars!!! The parameter wants
    //  the number of BYTES, not chars, so when you create a memory buffer
    //  give it the byte size (which just happens to be the same here.)
    //
    MemBufInputSource* memBufIS = new MemBufInputSource
    (
        (const XMLByte*)gXMLInMemBuf
        , strlen(gXMLInMemBuf)
        , gMemBufId
        , false
    );

    //
    //  Get the starting time and kick off the parse of the indicated
    //  file. Catch any exceptions that might propogate out of it.
    //
    unsigned long duration;
    int errorCount = 0;
    int errorCode = 0;
    try
    {
        const unsigned long startMillis = XMLPlatformUtils::getCurrentMillis();
        parser->parse(*memBufIS);
        const unsigned long endMillis = XMLPlatformUtils::getCurrentMillis();
        duration = endMillis - startMillis;
        errorCount = parser->getErrorCount();
    }
    catch (const OutOfMemoryException&)
    {
        std::cerr << "OutOfMemoryException" << std::endl;
        errorCode = 5;
    }
    catch (const XMLException& e)
    {
        std::cerr << "\nError during parsing memory stream:\n"
             << "Exception message is:  \n"
             << StrX(e.getMessage()) << "\n" << std::endl;
        errorCode = 4;
    }
    if(errorCode) {
        XMLPlatformUtils::Terminate();
        return errorCode;
    }

    // Print out the stats that we collected and time taken.
    if (!errorCount) {
        std::cout << "\nFinished parsing the memory buffer containing the following "
             << "XML statements:\n\n"
             << gXMLInMemBuf
             << "\n\n\n"
             << "Parsing took " << duration << " ms ("
             << handler.getElementCount() << " elements, "
             << handler.getAttrCount() << " attributes, "
             << handler.getSpaceCount() << " spaces, "
             << handler.getCharacterCount() << " characters).\n" << std::endl;
    }

    //
    //  Delete the parser itself.  Must be done prior to calling Terminate, below.
    //
    delete parser;

    delete memBufIS;

    // And call the termination method
    XMLPlatformUtils::Terminate();

    if (errorCount > 0)
        return 4;
    else
        return 0;
}